

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::AcesInputFile::AcesInputFile(AcesInputFile *this,IStream *is,int numThreads)

{
  void *pvVar1;
  undefined8 *in_RDI;
  int unaff_retaddr;
  IStream *in_stack_00000008;
  RgbaInputFile *in_stack_00000010;
  Data *in_stack_000002b0;
  
  *in_RDI = &PTR__AcesInputFile_00562878;
  pvVar1 = operator_new(0x70);
  Data::Data((Data *)0x2c5f3d);
  in_RDI[1] = pvVar1;
  pvVar1 = operator_new(0x38);
  RgbaInputFile::RgbaInputFile(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *(void **)in_RDI[1] = pvVar1;
  Data::initColorConversion(in_stack_000002b0);
  return;
}

Assistant:

AcesInputFile::AcesInputFile (IStream &is, int numThreads):
    _data (new Data)
{
    _data->rgbaFile = new RgbaInputFile (is, numThreads);
    _data->initColorConversion();
}